

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

void array_container_add_from_range(array_container_t *arr,uint32_t min,uint32_t max,uint16_t step)

{
  int iVar1;
  uint32_t value;
  
  if (min < max) {
    do {
      if (arr->cardinality == arr->capacity) {
        array_container_grow(arr,arr->capacity + 1,true);
      }
      iVar1 = arr->cardinality;
      arr->cardinality = iVar1 + 1;
      arr->array[iVar1] = (uint16_t)min;
      min = min + step;
    } while (min < max);
  }
  return;
}

Assistant:

void array_container_add_from_range(array_container_t *arr, uint32_t min,
                                    uint32_t max, uint16_t step) {
    for (uint32_t value = min; value < max; value += step) {
        array_container_append(arr, value);
    }
}